

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O3

int h264_level(bitstream *str,int suffixLength,int onebias,int32_t *val)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  uint32_t tmp;
  uint32_t level_suffix;
  uint32_t local_44;
  uint local_40;
  int local_3c;
  uint *local_38;
  
  if (str->dir == VS_ENCODE) {
    iVar1 = *val;
    uVar5 = iVar1 * 2 - 2;
    if (iVar1 < 0) {
      uVar5 = ~(iVar1 * 2);
    }
    local_40 = uVar5 - 2;
    if (onebias == 0) {
      local_40 = uVar5;
    }
    uVar5 = 0;
    iVar1 = 0xe;
    do {
      bVar6 = iVar1 != 0;
      iVar1 = iVar1 + -1;
      iVar4 = 4;
      if (bVar6) {
        iVar4 = suffixLength;
      }
      if (suffixLength != 0) {
        iVar4 = suffixLength;
      }
      iVar2 = uVar5 - 3;
      if (uVar5 < 0xf) {
        iVar2 = iVar4;
      }
      uVar3 = 1 << ((byte)iVar2 & 0x1f);
      if (local_40 < uVar3) {
        local_44 = 1;
        iVar1 = vs_u(str,&local_44,1);
        if (iVar1 != 0) {
          return 1;
        }
        if (iVar2 == 0) {
          return 0;
        }
        iVar1 = vs_u(str,&local_40,iVar2);
        if (iVar1 == 0) {
          return 0;
        }
        return 1;
      }
      uVar5 = uVar5 + 1;
      local_44 = 0;
      local_40 = local_40 - uVar3;
      iVar4 = vs_u(str,&local_44,1);
    } while (iVar4 == 0);
  }
  else {
    iVar1 = vs_u(str,&local_44,1);
    if (iVar1 == 0) {
      uVar5 = 0;
      iVar4 = -2;
      iVar1 = suffixLength;
      local_3c = onebias;
      local_38 = (uint *)val;
      do {
        if (local_44 != 0) {
          if (iVar1 != 0) {
            iVar1 = vs_u(str,&local_40,iVar1);
            if (iVar1 != 0) {
              return 1;
            }
            uVar5 = uVar5 + local_40;
          }
          uVar3 = uVar5 + 2;
          if (local_3c == 0) {
            uVar3 = uVar5;
          }
          uVar5 = ~((int)uVar3 >> 1);
          if ((uVar3 & 1) == 0) {
            uVar5 = (int)(uVar3 + 2) >> 1;
          }
          *local_38 = uVar5;
          return 0;
        }
        uVar5 = uVar5 + (1 << ((byte)iVar1 & 0x1f));
        iVar1 = 4;
        if (iVar4 != 0xb || suffixLength != 0) {
          iVar1 = suffixLength;
        }
        if (0xd < iVar4 + 2U) {
          iVar1 = iVar4;
        }
        iVar2 = vs_u(str,&local_44,1);
        iVar4 = iVar4 + 1;
      } while (iVar2 == 0);
    }
  }
  return 1;
}

Assistant:

int h264_level(struct bitstream *str, int suffixLength, int onebias, int32_t *val) {
	/*
	 * each level_prefix takes 1 << suffix_size consecutive level_codes from the code space
	 * level_prefix 0..13:
	 *   suffix size = suffixLength
	 * level prefix 14:
	 *   suffix size = suffixLength ? suffixLength : 4
	 * level prefix 15+:
	 *   suffix size = level_prefix - 3 [thus 12+]
	 */
	int suffix_size;
	int level_code;
	int level_prefix;
	uint32_t level_suffix;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val < 0)
			level_code = -((*val << 1) + 1);
		else
			level_code = ((*val << 1) - 2);
		if (onebias)
			level_code -= 2;

		level_prefix = 0;
		level_suffix = level_code;
		while (1) {
			suffix_size = suffixLength;
			if (level_prefix == 14 && !suffix_size)
				suffix_size = 4;
			if (level_prefix >= 15)
				suffix_size = level_prefix - 3;
			if (level_suffix < (1 << suffix_size))
				break;
			level_suffix -= (1 << suffix_size);
			level_prefix++;
			tmp = 0;
			if (vs_u(str, &tmp, 1)) return 1;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1)) return 1;
		if (suffix_size)
			if (vs_u(str, &level_suffix, suffix_size)) return 1;
	} else {
		level_code = 0;
		level_prefix = 0;
		while (1) {
			suffix_size = suffixLength;
			if (level_prefix == 14 && !suffix_size)
				suffix_size = 4;
			if (level_prefix >= 15)
				suffix_size = level_prefix - 3;
			if (vs_u(str, &tmp, 1)) return 1;
			if (tmp)
				break;
			level_code += (1 << suffix_size);
			level_prefix++;
		}
		if (suffix_size) {
			if (vs_u(str, &level_suffix, suffix_size)) return 1;
			level_code += level_suffix;
		}

		if (onebias)
			level_code += 2;
		if (level_code & 1)
			*val = (-level_code - 1) >> 1;
		else
			*val = (level_code + 2) >> 1;
	}
	return 0;
}